

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

Name __thiscall wasm::WasmBinaryReader::getElemName(WasmBinaryReader *this,Index index)

{
  size_type sVar1;
  reference this_00;
  pointer pEVar2;
  allocator<char> local_49;
  string local_48;
  uint local_24;
  WasmBinaryReader *pWStack_20;
  Index index_local;
  WasmBinaryReader *this_local;
  
  local_24 = index;
  pWStack_20 = this;
  sVar1 = std::
          vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
          ::size(&this->wasm->elementSegments);
  if (sVar1 <= index) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"invalid element segment index",&local_49);
    throwError(this,&local_48);
  }
  this_00 = std::
            vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ::operator[](&this->wasm->elementSegments,(ulong)local_24);
  pEVar2 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(this_00);
  return (IString)(IString)(pEVar2->super_Named).name.super_IString.str;
}

Assistant:

Name WasmBinaryReader::getElemName(Index index) {
  if (index >= wasm.elementSegments.size()) {
    throwError("invalid element segment index");
  }
  return wasm.elementSegments[index]->name;
}